

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O3

bool __thiscall
ArmParser::parsePseudoShift(ArmParser *this,Parser *parser,ArmOpcodeVariables *vars,int type)

{
  bool bVar1;
  bool bVar2;
  Token *pTVar3;
  
  (vars->Shift).Type = (uchar)type;
  bVar1 = parseRegisterTable(this,parser,&(vars->Shift).reg,armRegisters,0x13);
  if ((!bVar1) || (bVar1 = true, 0xf < (vars->Shift).reg.num)) {
    pTVar3 = Tokenizer::peekToken
                       ((parser->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
    if (pTVar3->type == Hash) {
      Tokenizer::eatTokens
                ((parser->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].tokenizer,1);
    }
    bVar2 = parseImmediate(this,parser,&(vars->Shift).ShiftExpression);
    bVar1 = false;
    if (!bVar2) {
      return false;
    }
  }
  (vars->Shift).ShiftByRegister = bVar1;
  (vars->Shift).UseShift = true;
  return true;
}

Assistant:

bool ArmParser::parsePseudoShift(Parser& parser, ArmOpcodeVariables& vars, int type)
{
	vars.Shift.Type = type;

	if (parseRegister(parser,vars.Shift.reg))
	{
		vars.Shift.ShiftByRegister = true;
	} else {
		if (parser.peekToken().type == TokenType::Hash)
			parser.eatToken();
		
		if (!parseImmediate(parser,vars.Shift.ShiftExpression))
			return false;

		vars.Shift.ShiftByRegister = false;
	}
	
	vars.Shift.UseShift = true;
	return true;
}